

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

_Bool container_nonzero_cardinality(container_t *c,uint8_t typecode)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int i;
  long lVar4;
  undefined3 in_register_00000031;
  uint uVar5;
  
  uVar5 = CONCAT31(in_register_00000031,typecode);
  if (uVar5 == 4) {
    uVar5 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  iVar2 = *c;
  if (((char)uVar5 == '\x03') || ((uVar5 & 0xff) == 2)) {
    bVar3 = 0 < iVar2;
  }
  else {
    if (iVar2 != -1) {
      return iVar2 != 0;
    }
    lVar4 = 0;
    do {
      bVar3 = lVar4 != 0x400;
      if (lVar4 == 0x400) {
        return bVar3;
      }
      lVar1 = lVar4 * 8;
      lVar4 = lVar4 + 1;
    } while (*(long *)(*(long *)((long)c + 8) + lVar1) == 0);
  }
  return bVar3;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}